

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void env_arr_new(char *identifer,int line,long numElements,Environment *env)

{
  undefined1 auVar1 [16];
  Record *pRVar2;
  Object *pOVar3;
  ulong uVar4;
  Object *pOVar5;
  Record **ppRVar6;
  long lVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  
  pRVar2 = env_match(identifer,env);
  if (pRVar2 != (Record *)0x0) {
    if ((pRVar2->object).type == OBJECT_ARRAY) {
      lVar8 = (long)(pRVar2->object).field_1.literal.line;
      (pRVar2->object).field_1.literal.line = (int)numElements;
      pOVar3 = (Object *)realloc((pRVar2->object).field_1.arr.values,numElements << 6);
      (pRVar2->object).field_1.arr.values = pOVar3;
      lVar7 = numElements - lVar8;
      if (lVar7 == 0 || numElements < lVar8) {
        return;
      }
      lVar8 = lVar8 << 6;
      do {
        *(undefined4 *)((long)&((pRVar2->object).field_1.arr.values)->type + lVar8) = 0;
        lVar8 = lVar8 + 0x40;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      return;
    }
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Variable %s is already defined!\x1b[0m",line,
           identifer);
  }
  pOVar3 = (Object *)malloc(numElements << 6);
  auVar1 = _DAT_001095a0;
  if (0 < numElements) {
    uVar4 = numElements + 3U & 0xfffffffffffffffc;
    lVar7 = numElements + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    pOVar5 = pOVar3 + 3;
    auVar9 = auVar9 ^ _DAT_001095a0;
    auVar11 = _DAT_00109580;
    auVar12 = _DAT_00109590;
    do {
      auVar13 = auVar12 ^ auVar1;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar10 && auVar9._0_4_ < auVar13._0_4_ || iVar10 < auVar13._4_4_
                  ) & 1)) {
        pOVar5[-3].type = OBJECT_NULL;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        pOVar5[-2].type = OBJECT_NULL;
      }
      auVar13 = auVar11 ^ auVar1;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar10 && (iVar14 != iVar10 || auVar13._0_4_ <= auVar9._0_4_)) {
        pOVar5[-1].type = OBJECT_NULL;
        pOVar5->type = OBJECT_NULL;
      }
      lVar7 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar7 + 4;
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar7 + 4;
      pOVar5 = pOVar5 + 4;
      uVar4 = uVar4 - 4;
    } while (uVar4 != 0);
  }
  pRVar2 = (Record *)malloc(0x50);
  pRVar2->name = identifer;
  (pRVar2->object).type = OBJECT_ARRAY;
  (pRVar2->object).field_1.instance = (Instance *)(numElements & 0xffffffff);
  (pRVar2->object).field_1.arr.values = pOVar3;
  pRVar2->next = (Record *)0x0;
  ppRVar6 = &env->rear;
  if (env->front != (Record *)0x0) {
    env = (Environment *)ppRVar6;
    ppRVar6 = &(*ppRVar6)->next;
  }
  *ppRVar6 = pRVar2;
  env->front = pRVar2;
  return;
}

Assistant:

void env_arr_new(char *identifer, int line, long numElements, Environment *env){
    Record *match = env_match(identifer, env);
    if(match != NULL && match->object.type != OBJECT_ARRAY)
        printf(runtime_error("Variable %s is already defined!"), line, identifer);
    else if(match != NULL){
        long bak = match->object.arr.count;
        match->object.arr.count = numElements;
        match->object.arr.values = (Object *)reallocate(match->object.arr.values, sizeof(Object)*numElements);
        while(bak < numElements){
            match->object.arr.values[bak].type = OBJECT_NULL;
            bak++;
        }
        return;
    }
    Object o;
    o.type = OBJECT_ARRAY;
    o.arr.count = numElements;
    o.arr.values = (Object *)mallocate(sizeof(Object) * numElements);
    long i = 0;
    while(i < numElements){
        o.arr.values[i].type = OBJECT_NULL;
        i++;
    }
    rec_new(identifer, o, env);
}